

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_int_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_int_&,_const_int_&> *this,ostream *os)

{
  StringRef SVar1;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  Catch::StringMaker<int,void>::convert_abi_cxx11_((int)local_40);
  SVar1 = this->m_op;
  Catch::StringMaker<int,void>::convert_abi_cxx11_((int)local_60);
  Catch::formatReconstructedExpression(os,(string *)local_40,SVar1,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }